

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O1

int __thiscall
QUnsortedModelEngine::buildIndices
          (QUnsortedModelEngine *this,QString *str,QModelIndex *parent,int n,QIndexMapper *indices,
          QMatchData *m)

{
  QList<int> *this_00;
  bool bVar1;
  bool bVar2;
  Int IVar3;
  int *piVar4;
  char cVar5;
  int iVar6;
  long *plVar7;
  ulong uVar8;
  long lVar9;
  CaseSensitivity CVar10;
  int iVar11;
  long lVar12;
  long in_FS_OFFSET;
  int local_c4;
  int local_bc;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 *local_88;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar7 = (long *)QAbstractProxyModel::sourceModel();
  this_00 = &(m->indices).vector;
  lVar12 = 0;
  local_bc = 0;
  while( true ) {
    bVar1 = indices->v;
    if (bVar1 == true) {
      iVar6 = (int)(indices->vector).d.size;
    }
    else {
      iVar6 = (indices->t - indices->f) + 1;
    }
    iVar11 = (int)lVar12;
    if ((iVar6 <= lVar12) || (local_bc == n)) break;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = 0xaaaaaaaa;
    uStack_74 = 0xaaaaaaaa;
    uStack_70 = 0xaaaaaaaa;
    uStack_6c = 0xaaaaaaaa;
    if (bVar1 == false) {
      iVar6 = indices->f + iVar11;
    }
    else {
      iVar6 = (indices->vector).d.ptr[lVar12];
    }
    (**(code **)(*plVar7 + 0x60))
              (&local_78,plVar7,iVar6,((this->super_QCompletionEngine).c)->column,parent);
    uVar8 = (**(code **)(*plVar7 + 0x138))(plVar7,&local_78);
    bVar1 = false;
    if ((uVar8 & 1) != 0) {
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = 0xaaaaaaaa;
      uStack_94 = 0xaaaaaaaa;
      uStack_90 = 0xaaaaaaaa;
      uStack_8c = 0xaaaaaaaa;
      (**(code **)(*plVar7 + 0x90))
                (&local_58,plVar7,&local_78,((this->super_QCompletionEngine).c)->role);
      ::QVariant::toString();
      ::QVariant::~QVariant((QVariant *)&local_58);
      IVar3 = (((this->super_QCompletionEngine).c)->filterMode).
              super_QFlagsStorageHelper<Qt::MatchFlag,_4>.super_QFlagsStorage<Qt::MatchFlag>.i;
      CVar10 = (CaseSensitivity)str;
      if (IVar3 == 1) {
        lVar9 = QString::indexOf((QString *)&local_98,(longlong)str,CaseInsensitive);
        if (lVar9 != -1) goto LAB_00659091;
        bVar1 = false;
      }
      else {
        if (IVar3 == 3) {
          cVar5 = QString::endsWith((QString *)&local_98,CVar10);
        }
        else {
          if (IVar3 != 2) goto LAB_00659091;
          cVar5 = QString::startsWith((QString *)&local_98,CVar10);
        }
        bVar1 = false;
        if (cVar5 != '\0') {
LAB_00659091:
          if (indices->v == true) {
            local_58._0_4_ = (indices->vector).d.ptr[lVar12];
          }
          else {
            local_58._0_4_ = indices->f + iVar11;
          }
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)this_00,(m->indices).vector.d.size,(int *)local_58.data);
          QList<int>::end(this_00);
          local_bc = local_bc + 1;
          bVar1 = false;
          if ((m->exactMatchIndex == -1) &&
             (iVar6 = QString::compare((QString *)&local_98,CVar10), iVar6 == 0)) {
            bVar2 = indices->v;
            if (bVar2 == true) {
              iVar6 = (indices->vector).d.ptr[lVar12];
            }
            else {
              iVar6 = indices->f + iVar11;
            }
            m->exactMatchIndex = iVar6;
            if (n == -1) {
              if (bVar2 == false) {
                local_c4 = indices->f + iVar11;
              }
              else {
                local_c4 = (indices->vector).d.ptr[lVar12];
              }
              bVar1 = true;
            }
          }
        }
      }
      piVar4 = (int *)CONCAT44(uStack_94,local_98);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_94,local_98),2,0x10);
        }
      }
    }
    if (bVar1) goto LAB_0065919d;
    lVar12 = lVar12 + 1;
  }
  if (bVar1 == false) {
    local_c4 = indices->f + iVar11 + -1;
  }
  else {
    local_c4 = (indices->vector).d.ptr[lVar12 + -1];
  }
LAB_0065919d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_c4;
}

Assistant:

int QUnsortedModelEngine::buildIndices(const QString& str, const QModelIndex& parent, int n,
                                      const QIndexMapper& indices, QMatchData* m)
{
    Q_ASSERT(m->partial);
    Q_ASSERT(n != -1 || m->exactMatchIndex == -1);
    const QAbstractItemModel *model = c->proxy->sourceModel();
    int i, count = 0;

    for (i = 0; i < indices.count() && count != n; ++i) {
        QModelIndex idx = model->index(indices[i], c->column, parent);

        if (!(model->flags(idx) & Qt::ItemIsSelectable))
            continue;

        QString data = model->data(idx, c->role).toString();

        switch (c->filterMode) {
        case Qt::MatchStartsWith:
            if (!data.startsWith(str, c->cs))
                continue;
            break;
        case Qt::MatchContains:
            if (!data.contains(str, c->cs))
                continue;
            break;
        case Qt::MatchEndsWith:
            if (!data.endsWith(str, c->cs))
                continue;
            break;
        case Qt::MatchExactly:
        case Qt::MatchFixedString:
        case Qt::MatchCaseSensitive:
        case Qt::MatchRegularExpression:
        case Qt::MatchWildcard:
        case Qt::MatchWrap:
        case Qt::MatchRecursive:
            Q_UNREACHABLE();
            break;
        }
        m->indices.append(indices[i]);
        ++count;
        if (m->exactMatchIndex == -1 && QString::compare(data, str, c->cs) == 0) {
            m->exactMatchIndex = indices[i];
            if (n == -1)
                return indices[i];
        }
    }
    return indices[i-1];
}